

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extrinsic_geometry_interface.cpp
# Opt level: O3

void __thiscall
geometrycentral::surface::ExtrinsicGeometryInterface::computeVertexPrincipalCurvatureDirections
          (ExtrinsicGeometryInterface *this)

{
  Vector2 *pVVar1;
  Vector2 VVar2;
  bool bVar3;
  SurfaceMesh *pSVar4;
  size_t sVar5;
  pointer puVar6;
  Vector2 *pVVar7;
  double *pdVar8;
  Vector2 *pVVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  long lVar12;
  size_t i_1;
  size_t sVar13;
  size_t i;
  ulong uVar14;
  unsigned_long uVar15;
  ulong *puVar16;
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector2> local_70;
  
  if ((this->super_IntrinsicGeometryInterface).edgeLengthsQ.super_DependentQuantity.computed ==
      false) {
    if ((this->super_IntrinsicGeometryInterface).edgeLengthsQ.super_DependentQuantity.evaluateFunc.
        super__Function_base._M_manager == (_Manager_type)0x0) goto LAB_001e4608;
    (*(this->super_IntrinsicGeometryInterface).edgeLengthsQ.super_DependentQuantity.evaluateFunc.
      _M_invoker)((_Any_data *)
                  &(this->super_IntrinsicGeometryInterface).edgeLengthsQ.super_DependentQuantity.
                   evaluateFunc);
    (this->super_IntrinsicGeometryInterface).edgeLengthsQ.super_DependentQuantity.computed = true;
  }
  if ((this->super_IntrinsicGeometryInterface).halfedgeVectorsInVertexQ.super_DependentQuantity.
      computed == false) {
    if ((this->super_IntrinsicGeometryInterface).halfedgeVectorsInVertexQ.super_DependentQuantity.
        evaluateFunc.super__Function_base._M_manager == (_Manager_type)0x0) goto LAB_001e4608;
    (*(this->super_IntrinsicGeometryInterface).halfedgeVectorsInVertexQ.super_DependentQuantity.
      evaluateFunc._M_invoker)
              ((_Any_data *)
               &(this->super_IntrinsicGeometryInterface).halfedgeVectorsInVertexQ.
                super_DependentQuantity.evaluateFunc);
    (this->super_IntrinsicGeometryInterface).halfedgeVectorsInVertexQ.super_DependentQuantity.
    computed = true;
  }
  if ((this->edgeDihedralAnglesQ).super_DependentQuantity.computed == false) {
    if ((this->edgeDihedralAnglesQ).super_DependentQuantity.evaluateFunc.super__Function_base.
        _M_manager == (_Manager_type)0x0) {
LAB_001e4608:
      ::std::__throw_bad_function_call();
    }
    (*(this->edgeDihedralAnglesQ).super_DependentQuantity.evaluateFunc._M_invoker)
              ((_Any_data *)&(this->edgeDihedralAnglesQ).super_DependentQuantity.evaluateFunc);
    (this->edgeDihedralAnglesQ).super_DependentQuantity.computed = true;
  }
  MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector2>::MeshData
            (&local_70,(this->super_IntrinsicGeometryInterface).super_BaseGeometryInterface.mesh);
  MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector2>::operator=
            (&this->vertexPrincipalCurvatureDirections,&local_70);
  MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector2>::~MeshData(&local_70);
  pSVar4 = (this->super_IntrinsicGeometryInterface).super_BaseGeometryInterface.mesh;
  sVar5 = pSVar4->nVerticesFillCount;
  if ((sVar5 == 0) ||
     (puVar6 = (pSVar4->vHalfedgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start, *puVar6 != 0xffffffffffffffff)) {
    sVar13 = 0;
  }
  else {
    sVar13 = 0;
    do {
      if (sVar5 - 1 == sVar13) {
        return;
      }
      lVar12 = sVar13 + 1;
      sVar13 = sVar13 + 1;
    } while (puVar6[lVar12] == 0xffffffffffffffff);
  }
  if (sVar13 != sVar5) {
    pVVar7 = (this->vertexPrincipalCurvatureDirections).data.
             super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector2,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    puVar6 = (pSVar4->vHalfedgeArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    bVar3 = pSVar4->useImplicitTwinFlag;
    pdVar8 = (this->edgeDihedralAngles).data.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    pVVar9 = (this->super_IntrinsicGeometryInterface).halfedgeVectorsInVertex.data.
             super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector2,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    do {
      uVar10 = puVar6[sVar13];
      dVar18 = 0.0;
      dVar19 = 0.0;
      uVar14 = uVar10;
      do {
        if (bVar3 == false) {
          uVar15 = (pSVar4->heEdgeArr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar14];
        }
        else {
          uVar15 = uVar14 >> 1;
        }
        dVar20 = 1.0 / (this->super_IntrinsicGeometryInterface).edgeLengths.data.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data[uVar15];
        VVar2 = pVVar9[uVar14];
        auVar22._0_8_ = -pVVar9[uVar14].y;
        auVar22._8_8_ = 0x8000000000000000;
        auVar17 = vshufpd_avx((undefined1  [16])VVar2,(undefined1  [16])VVar2,1);
        auVar11 = vshufpd_avx((undefined1  [16])VVar2,auVar22,1);
        auVar23._0_8_ = auVar17._0_8_ * auVar11._0_8_;
        auVar23._8_8_ = auVar17._8_8_ * auVar11._8_8_;
        auVar17._8_8_ = pVVar9[uVar14].x;
        auVar17._0_8_ = pVVar9[uVar14].x;
        auVar17 = vfnmadd231pd_avx512vl(auVar23,(undefined1  [16])VVar2,auVar17);
        auVar21._0_8_ = dVar20 * auVar17._0_8_;
        auVar21._8_8_ = dVar20 * auVar17._8_8_;
        dVar20 = pdVar8[uVar15];
        auVar11._8_8_ = dVar20;
        auVar11._0_8_ = dVar20;
        auVar17 = vmulpd_avx512vl(auVar21,auVar11);
        puVar16 = (pSVar4->heNextArr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start + (uVar14 ^ 1);
        if (bVar3 == false) {
          puVar16 = (pSVar4->heVertOutNextArr).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + uVar14;
        }
        uVar14 = *puVar16;
        dVar18 = dVar18 + auVar17._0_8_;
        dVar19 = dVar19 + auVar17._8_8_;
      } while (uVar14 != uVar10);
      pVVar1 = pVVar7 + sVar13;
      pVVar1->x = dVar18 * 0.25;
      pVVar1->y = dVar19 * 0.25;
      do {
        if (sVar5 - 1 == sVar13) {
          return;
        }
        lVar12 = sVar13 + 1;
        sVar13 = sVar13 + 1;
      } while (puVar6[lVar12] == 0xffffffffffffffff);
    } while (sVar5 != sVar13);
  }
  return;
}

Assistant:

void ExtrinsicGeometryInterface::computeVertexPrincipalCurvatureDirections() {
  edgeLengthsQ.ensureHave();
  halfedgeVectorsInVertexQ.ensureHave();
  edgeDihedralAnglesQ.ensureHave();

  vertexPrincipalCurvatureDirections = VertexData<Vector2>(mesh);

  for (Vertex v : mesh.vertices()) {
    Vector2 principalDir{0.0, 0.0};
    for (Halfedge he : v.outgoingHalfedges()) {
      double len = edgeLengths[he.edge()];
      double alpha = edgeDihedralAngles[he.edge()];
      Vector2 vec = halfedgeVectorsInVertex[he];
      principalDir += -vec * vec / len * alpha;
    }

    vertexPrincipalCurvatureDirections[v] = principalDir / 4;
  }
}